

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

bool __thiscall PDA::addTransition(PDA *this,Transition *transition)

{
  bool bVar1;
  bool bVar2;
  char c;
  State *pSVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *this_00;
  bool local_b2;
  string local_b0;
  byte local_89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  byte local_6d;
  string local_60;
  string local_40;
  Transition *local_20;
  Transition *transition_local;
  PDA *this_local;
  
  local_20 = transition;
  transition_local = (Transition *)this;
  pSVar3 = Transition::getStateFrom(transition);
  psVar4 = State::getName_abi_cxx11_(pSVar3);
  std::__cxx11::string::string((string *)&local_40,(string *)psVar4);
  bVar2 = containsState(this,&local_40);
  local_6d = 0;
  local_89 = 0;
  bVar1 = false;
  local_b2 = false;
  if (bVar2) {
    pSVar3 = Transition::getStateTo(local_20);
    psVar4 = State::getName_abi_cxx11_(pSVar3);
    std::__cxx11::string::string((string *)&local_60,(string *)psVar4);
    local_6d = 1;
    bVar2 = containsState(this,&local_60);
    local_b2 = false;
    if (bVar2) {
      __x = Transition::getStackPush_abi_cxx11_(local_20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_88,__x);
      local_89 = 1;
      bVar2 = inStackAlphabet(this,&local_88);
      local_b2 = false;
      if (bVar2) {
        c = Transition::getInput(local_20);
        bVar2 = inAlphabet(this,c);
        local_b2 = false;
        if (bVar2) {
          Transition::getStackInput_abi_cxx11_(&local_b0,local_20);
          bVar1 = true;
          local_b2 = inStackAlphabet(this,&local_b0);
        }
      }
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((local_89 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  if ((local_6d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_40);
  if (local_b2 != false) {
    std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
              ((vector<Transition*,std::allocator<Transition*>> *)&this->transitionFunctionD,
               &local_20);
    pSVar3 = Transition::getStateFrom(local_20);
    State::addTransition(pSVar3,local_20);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Error adding transition");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return local_b2 != false;
}

Assistant:

bool PDA::addTransition(Transition *transition) {
    if (containsState(transition->getStateFrom()->getName()) &&
        containsState(transition->getStateTo()->getName()) &&
        inStackAlphabet(transition->getStackPush()) &&
        inAlphabet(transition->getInput()) &&
        inStackAlphabet(transition->getStackInput())) {
        transitionFunctionD.emplace_back(transition);
        transition->getStateFrom()->addTransition(transition);
        return true;
    } else {
        std::cerr << "Error adding transition" << std::endl;
    }
    return false;
}